

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::
GenerateMemberConstexprConstructor(SingularStringView *this,Printer *p)

{
  char *pcVar1;
  undefined8 uStack_8;
  
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    pcVar1 = "$name$_(nullptr, false)";
    uStack_8 = 0x17;
  }
  else if (this->opts_->experimental_use_micro_string == true) {
    if (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ ==
        (string *)0x0) {
      pcVar1 = "$name$_{}";
      uStack_8 = 9;
    }
    else {
      pcVar1 = "$name$_($default_variable_field$)";
      uStack_8 = 0x21;
    }
  }
  else {
    pcVar1 = "$name$_(\n    &$pbi$::fixed_address_empty_string,\n    ::_pbi::ConstantInitialized())"
    ;
    uStack_8 = 0x53;
  }
  io::Printer::Emit(p,uStack_8,pcVar1);
  return;
}

Assistant:

void GenerateMemberConstexprConstructor(io::Printer* p) const override {
    if (is_inlined()) {
      p->Emit("$name$_(nullptr, false)");
    } else if (use_micro_string()) {
      if (EmptyDefault()) {
        p->Emit("$name$_{}");
      } else {
        p->Emit("$name$_($default_variable_field$)");
      }
    } else {
      p->Emit(
          "$name$_(\n"
          "    &$pbi$::fixed_address_empty_string,\n"
          "    ::_pbi::ConstantInitialized())");
    }
  }